

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Attribute_Access<int,_chaiscript::File_Position>::~Attribute_Access
          (Attribute_Access<int,_chaiscript::File_Position> *this)

{
  void *in_RDI;
  
  ~Attribute_Access((Attribute_Access<int,_chaiscript::File_Position> *)0x3cb278);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~Attribute_Access() {}